

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer *peer,ENetChannel *channel)

{
  ENetList *pEVar1;
  enet_uint16 eVar2;
  _ENetListNode *dataFirst;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var3;
  
  pEVar1 = &channel->incomingReliableCommands;
  p_Var3 = &pEVar1->sentinel;
  while (((p_Var3 = ((ENetListNode *)&p_Var3->next)->next, p_Var3 != &pEVar1->sentinel &&
          (*(int *)((long)&p_Var3[4].previous + 4) == 0)) &&
         (eVar2 = *(enet_uint16 *)&p_Var3[1].next,
         eVar2 == (enet_uint16)(channel->incomingReliableSequenceNumber + 1)))) {
    channel->incomingReliableSequenceNumber = eVar2;
    if (*(int *)&p_Var3[4].previous != 0) {
      channel->incomingReliableSequenceNumber = (eVar2 + (short)*(int *)&p_Var3[4].previous) - 1;
    }
  }
  dataFirst = (pEVar1->sentinel).next;
  if (p_Var3 != dataFirst) {
    channel->incomingUnreliableSequenceNumber = 0;
    enet_list_move(&(peer->dispatchedCommands).sentinel,dataFirst,p_Var3->previous);
    if (peer->needsDispatch == 0) {
      enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
      peer->needsDispatch = 1;
    }
    if ((channel->incomingUnreliableCommands).sentinel.next !=
        &(channel->incomingUnreliableCommands).sentinel) {
      enet_peer_dispatch_incoming_unreliable_commands(peer,channel);
      return;
    }
  }
  return;
}

Assistant:

void
enet_peer_dispatch_incoming_reliable_commands (ENetPeer * peer, ENetChannel * channel)
{
    ENetListIterator currentCommand;

    for (currentCommand = enet_list_begin (& channel -> incomingReliableCommands);
         currentCommand != enet_list_end (& channel -> incomingReliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;
         
       if (incomingCommand -> fragmentsRemaining > 0 ||
           incomingCommand -> reliableSequenceNumber != (enet_uint16) (channel -> incomingReliableSequenceNumber + 1))
         break;

       channel -> incomingReliableSequenceNumber = incomingCommand -> reliableSequenceNumber;

       if (incomingCommand -> fragmentCount > 0)
         channel -> incomingReliableSequenceNumber += incomingCommand -> fragmentCount - 1;
    } 

    if (currentCommand == enet_list_begin (& channel -> incomingReliableCommands))
      return;

    channel -> incomingUnreliableSequenceNumber = 0;

    enet_list_move (enet_list_end (& peer -> dispatchedCommands), enet_list_begin (& channel -> incomingReliableCommands), enet_list_previous (currentCommand));

    if (! peer -> needsDispatch)
    {
       enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

       peer -> needsDispatch = 1;
    }

    if (! enet_list_empty (& channel -> incomingUnreliableCommands))
       enet_peer_dispatch_incoming_unreliable_commands (peer, channel);
}